

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O0

void __thiscall asl::TabularDataFile::TabularDataFile(TabularDataFile *this,String *filename)

{
  String *ctx;
  String *filename_local;
  TabularDataFile *this_local;
  
  ctx = filename;
  TextFile::TextFile(&this->_file);
  Array<asl::String>::Array(&this->_columnNames);
  Array<asl::Var>::Array(&this->_row);
  asl::String::String(&this->_currentLine);
  Array<asl::String>::Array(&this->_currentRowParts);
  asl::String::String(&this->_name);
  asl::String::String(&this->_types);
  asl::String::String(&this->_equote);
  init(this,(EVP_PKEY_CTX *)ctx);
  asl::String::operator=(&this->_name,filename);
  return;
}

Assistant:

TabularDataFile::TabularDataFile(const String& filename)
{
	init();
	_name = filename;
}